

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

void __thiscall
kratos::FSM::FSM(FSM *this,string *name,Generator *generator,shared_ptr<kratos::Var> *clk,
                shared_ptr<kratos::Var> *reset)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int local_44 [5];
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->generator_ = generator;
  (this->outputs_)._M_h._M_buckets = &(this->outputs_)._M_h._M_single_bucket;
  (this->outputs_)._M_h._M_bucket_count = 1;
  (this->outputs_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->outputs_)._M_h._M_element_count = 0;
  (this->outputs_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->outputs_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->outputs_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->clk_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (clk->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->clk_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (clk->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (clk->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->clk_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (clk->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (reset->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (reset->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (reset->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (reset->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->states_)._M_t._M_impl.super__Rb_tree_header;
  (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->states_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->state_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_44[0] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[1],_int,_true>(&this->start_state_debug_,(char (*) [1])0x21f5b0,local_44);
  this->current_state_ = (EnumVar *)0x0;
  (this->fn_name_ln_)._M_h._M_buckets = &(this->fn_name_ln_)._M_h._M_single_bucket;
  (this->fn_name_ln_)._M_h._M_bucket_count = 1;
  (this->fn_name_ln_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fn_name_ln_)._M_h._M_element_count = 0;
  (this->fn_name_ln_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fn_name_ln_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fn_name_ln_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->realized_ = false;
  this->moore_ = true;
  this->reset_high_ = true;
  this->parent_fsm_ = (FSM *)0x0;
  p_Var1 = &(this->child_fsms_)._M_t._M_impl.super__Rb_tree_header;
  (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

FSM::FSM(std::string name, kratos::Generator* generator, std::shared_ptr<Var> clk,
         std::shared_ptr<Var> reset)
    : fsm_name_(std::move(name)),
      generator_(generator),
      clk_(std::move(clk)),
      reset_(std::move(reset)) {}